

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O1

void __thiscall QPDFObject::assign_null(QPDFObject *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  QPDF_Null local_9;
  
  std::
  variant<std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
  ::operator=((variant<std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
               *)this,&local_9);
  this_00 = (this->object_description).
            super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->object_description).
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->object_description).
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->qpdf = (QPDF *)0x0;
  (this->og).obj = 0;
  (this->og).gen = 0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this->parsed_offset = -1;
  return;
}

Assistant:

void
    assign_null()
    {
        value = QPDF_Null();
        qpdf = nullptr;
        og = QPDFObjGen();
        object_description = nullptr;
        parsed_offset = -1;
    }